

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx::create_pipeline(ConvolutionDepthWise_x86_avx *this,Option *opt)

{
  int *piVar1;
  ulong uVar2;
  int iVar3;
  Layer *pLVar4;
  undefined8 *puVar5;
  byte *in_RSI;
  long in_RDI;
  Mat weight_data_r2_1;
  Mat weight_data_r2;
  int elempack;
  int channels;
  int maxk;
  Option *in_stack_00000600;
  ConvolutionDepthWise_x86_avx *in_stack_00000608;
  Option *in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  int iVar7;
  void **ppvVar6;
  Mat *in_stack_fffffffffffffde8;
  Mat *dst;
  Mat *in_stack_fffffffffffffdf0;
  int local_1f8;
  void *local_1e8;
  int *local_1e0;
  Allocator *local_1c8;
  Option *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  Mat *in_stack_fffffffffffffe58;
  Option *in_stack_fffffffffffffe60;
  Mat *in_stack_fffffffffffffe68;
  undefined4 local_190;
  int in_stack_fffffffffffffe74;
  int *local_188;
  long *local_170;
  int local_144;
  int local_124;
  void *__ptr;
  
  iVar7 = (int)((ulong)in_stack_fffffffffffffde0 >> 0x20);
  if (*(int *)(in_RDI + 0x160) == 0) {
    pLVar4 = create_activation_layer
                       (in_stack_fffffffffffffe74,in_stack_fffffffffffffe68,
                        in_stack_fffffffffffffe60);
    *(Layer **)(in_RDI + 0x2d0) = pLVar4;
    if (((in_RSI[0x1e] & 1) == 0) || (*(long *)(in_RDI + 0x178) != 1)) {
      uVar2 = (long)*(int *)(in_RDI + 0x104) / (long)*(int *)(in_RDI + 0x108);
      iVar3 = ((int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
                    (long)(*(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd8))) /
              (*(int *)(in_RDI + 0xd0) / *(int *)(in_RDI + 0x108))) * *(int *)(in_RDI + 0x108);
      if ((iVar3 == *(int *)(in_RDI + 0x108)) &&
         (*(int *)(in_RDI + 0x108) == *(int *)(in_RDI + 0xd0))) {
        local_144 = 1;
        if ((in_RSI[0x27] & 1) != 0) {
          if (iVar3 % 8 == 0) {
            local_1f8 = 8;
          }
          else {
            local_1f8 = 1;
            if (iVar3 % 4 == 0) {
              local_1f8 = 4;
            }
          }
          local_144 = local_1f8;
        }
        if (local_144 == 8) {
          Mat::reshape(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,in_stack_fffffffffffffe50
                       ,(Allocator *)in_stack_fffffffffffffe48);
          convert_packing(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,iVar7,
                          in_stack_fffffffffffffdd8);
          if (local_188 != (int *)0x0) {
            LOCK();
            iVar3 = *local_188;
            *local_188 = *local_188 + -1;
            UNLOCK();
            if (iVar3 == 1) {
              if (local_170 == (long *)0x0) {
                if (__ptr != (void *)0x0) {
                  free(__ptr);
                }
              }
              else {
                (**(code **)(*local_170 + 0x18))(local_170,__ptr);
              }
            }
          }
        }
        if (local_144 == 4) {
          dst = (Mat *)&local_1e8;
          Mat::reshape(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,in_stack_fffffffffffffe50
                       ,(Allocator *)in_stack_fffffffffffffe48);
          convert_packing(in_stack_fffffffffffffdf0,dst,iVar7,in_stack_fffffffffffffdd8);
          ppvVar6 = &local_1e8;
          if (local_1e0 != (int *)0x0) {
            LOCK();
            iVar7 = *local_1e0;
            *local_1e0 = *local_1e0 + -1;
            UNLOCK();
            if (iVar7 == 1) {
              if (local_1c8 == (Allocator *)0x0) {
                if (local_1e8 != (void *)0x0) {
                  free(local_1e8);
                }
              }
              else {
                (*local_1c8->_vptr_Allocator[3])(local_1c8,local_1e8);
              }
            }
          }
          *ppvVar6 = (void *)0x0;
          ppvVar6[2] = (void *)0x0;
          *(undefined4 *)(ppvVar6 + 3) = 0;
          *(undefined4 *)(ppvVar6 + 5) = 0;
          *(undefined4 *)((long)ppvVar6 + 0x2c) = 0;
          *(undefined4 *)(ppvVar6 + 6) = 0;
          *(undefined4 *)((long)ppvVar6 + 0x34) = 0;
          *(undefined4 *)(ppvVar6 + 7) = 0;
          ppvVar6[8] = (void *)0x0;
          ppvVar6[1] = (void *)0x0;
        }
        if (local_144 == 1) {
          if ((((*(int *)(in_RDI + 0xd4) == 3) && (*(int *)(in_RDI + 0xd8) == 3)) &&
              (*(int *)(in_RDI + 0xdc) == 1)) &&
             (((*(int *)(in_RDI + 0xe0) == 1 && (*(int *)(in_RDI + 0xe4) == 1)) &&
              (*(int *)(in_RDI + 0xe8) == 1)))) {
            puVar5 = (undefined8 *)(in_RDI + 0x2f0);
            if (puVar5 != (undefined8 *)(in_RDI + 0x168)) {
              if (*(long *)(in_RDI + 0x170) != 0) {
                LOCK();
                **(int **)(in_RDI + 0x170) = **(int **)(in_RDI + 0x170) + 1;
                UNLOCK();
              }
              if (*(long *)(in_RDI + 0x2f8) != 0) {
                piVar1 = *(int **)(in_RDI + 0x2f8);
                LOCK();
                iVar7 = *piVar1;
                *piVar1 = *piVar1 + -1;
                UNLOCK();
                if (iVar7 == 1) {
                  if (*(long *)(in_RDI + 0x310) == 0) {
                    if ((void *)*puVar5 != (void *)0x0) {
                      free((void *)*puVar5);
                    }
                  }
                  else {
                    (**(code **)(**(long **)(in_RDI + 0x310) + 0x18))
                              (*(long **)(in_RDI + 0x310),*puVar5);
                  }
                }
              }
              *puVar5 = 0;
              *(undefined8 *)(in_RDI + 0x300) = 0;
              *(undefined4 *)(in_RDI + 0x308) = 0;
              *(undefined4 *)(in_RDI + 0x318) = 0;
              *(undefined4 *)(in_RDI + 0x31c) = 0;
              *(undefined4 *)(in_RDI + 800) = 0;
              *(undefined4 *)(in_RDI + 0x324) = 0;
              *(undefined4 *)(in_RDI + 0x328) = 0;
              *(undefined8 *)(in_RDI + 0x330) = 0;
              *(undefined8 *)(in_RDI + 0x2f8) = 0;
              *puVar5 = *(undefined8 *)(in_RDI + 0x168);
              *(undefined8 *)(in_RDI + 0x2f8) = *(undefined8 *)(in_RDI + 0x170);
              *(undefined8 *)(in_RDI + 0x300) = *(undefined8 *)(in_RDI + 0x178);
              *(undefined4 *)(in_RDI + 0x308) = *(undefined4 *)(in_RDI + 0x180);
              *(undefined8 *)(in_RDI + 0x310) = *(undefined8 *)(in_RDI + 0x188);
              *(undefined4 *)(in_RDI + 0x318) = *(undefined4 *)(in_RDI + 400);
              *(undefined4 *)(in_RDI + 0x31c) = *(undefined4 *)(in_RDI + 0x194);
              *(undefined4 *)(in_RDI + 800) = *(undefined4 *)(in_RDI + 0x198);
              *(undefined4 *)(in_RDI + 0x324) = *(undefined4 *)(in_RDI + 0x19c);
              *(undefined4 *)(in_RDI + 0x328) = *(undefined4 *)(in_RDI + 0x1a0);
              *(undefined8 *)(in_RDI + 0x330) = *(undefined8 *)(in_RDI + 0x1a8);
            }
          }
          else if (((*(int *)(in_RDI + 0xd4) == 3) && (*(int *)(in_RDI + 0xd8) == 3)) &&
                  ((*(int *)(in_RDI + 0xdc) == 1 &&
                   (((*(int *)(in_RDI + 0xe0) == 1 && (*(int *)(in_RDI + 0xe4) == 2)) &&
                    (*(int *)(in_RDI + 0xe8) == 2)))))) {
            puVar5 = (undefined8 *)(in_RDI + 0x2f0);
            if (puVar5 != (undefined8 *)(in_RDI + 0x168)) {
              if (*(long *)(in_RDI + 0x170) != 0) {
                LOCK();
                **(int **)(in_RDI + 0x170) = **(int **)(in_RDI + 0x170) + 1;
                UNLOCK();
              }
              if (*(long *)(in_RDI + 0x2f8) != 0) {
                piVar1 = *(int **)(in_RDI + 0x2f8);
                LOCK();
                iVar7 = *piVar1;
                *piVar1 = *piVar1 + -1;
                UNLOCK();
                if (iVar7 == 1) {
                  if (*(long *)(in_RDI + 0x310) == 0) {
                    if ((void *)*puVar5 != (void *)0x0) {
                      free((void *)*puVar5);
                    }
                  }
                  else {
                    (**(code **)(**(long **)(in_RDI + 0x310) + 0x18))
                              (*(long **)(in_RDI + 0x310),*puVar5);
                  }
                }
              }
              *puVar5 = 0;
              *(undefined8 *)(in_RDI + 0x300) = 0;
              *(undefined4 *)(in_RDI + 0x308) = 0;
              *(undefined4 *)(in_RDI + 0x318) = 0;
              *(undefined4 *)(in_RDI + 0x31c) = 0;
              *(undefined4 *)(in_RDI + 800) = 0;
              *(undefined4 *)(in_RDI + 0x324) = 0;
              *(undefined4 *)(in_RDI + 0x328) = 0;
              *(undefined8 *)(in_RDI + 0x330) = 0;
              *(undefined8 *)(in_RDI + 0x2f8) = 0;
              *puVar5 = *(undefined8 *)(in_RDI + 0x168);
              *(undefined8 *)(in_RDI + 0x2f8) = *(undefined8 *)(in_RDI + 0x170);
              *(undefined8 *)(in_RDI + 0x300) = *(undefined8 *)(in_RDI + 0x178);
              *(undefined4 *)(in_RDI + 0x308) = *(undefined4 *)(in_RDI + 0x180);
              *(undefined8 *)(in_RDI + 0x310) = *(undefined8 *)(in_RDI + 0x188);
              *(undefined4 *)(in_RDI + 0x318) = *(undefined4 *)(in_RDI + 400);
              *(undefined4 *)(in_RDI + 0x31c) = *(undefined4 *)(in_RDI + 0x194);
              *(undefined4 *)(in_RDI + 800) = *(undefined4 *)(in_RDI + 0x198);
              *(undefined4 *)(in_RDI + 0x324) = *(undefined4 *)(in_RDI + 0x19c);
              *(undefined4 *)(in_RDI + 0x328) = *(undefined4 *)(in_RDI + 0x1a0);
              *(undefined8 *)(in_RDI + 0x330) = *(undefined8 *)(in_RDI + 0x1a8);
            }
          }
          else {
            create_group_ops(in_stack_00000608,in_stack_00000600);
          }
        }
        if ((*in_RSI & 1) != 0) {
          puVar5 = (undefined8 *)(in_RDI + 0x168);
          if (*(long *)(in_RDI + 0x170) != 0) {
            piVar1 = *(int **)(in_RDI + 0x170);
            LOCK();
            iVar7 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (iVar7 == 1) {
              if (*(long *)(in_RDI + 0x188) == 0) {
                if ((void *)*puVar5 != (void *)0x0) {
                  free((void *)*puVar5);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x188) + 0x18))
                          (*(long **)(in_RDI + 0x188),*puVar5);
              }
            }
          }
          *puVar5 = 0;
          *(undefined8 *)(in_RDI + 0x178) = 0;
          *(undefined4 *)(in_RDI + 0x180) = 0;
          *(undefined4 *)(in_RDI + 400) = 0;
          *(undefined4 *)(in_RDI + 0x194) = 0;
          *(undefined4 *)(in_RDI + 0x198) = 0;
          *(undefined4 *)(in_RDI + 0x19c) = 0;
          *(undefined4 *)(in_RDI + 0x1a0) = 0;
          *(undefined8 *)(in_RDI + 0x1a8) = 0;
          *(undefined8 *)(in_RDI + 0x170) = 0;
        }
        local_124 = 0;
      }
      else {
        create_group_ops(in_stack_00000608,in_stack_00000600);
        if ((*in_RSI & 1) != 0) {
          puVar5 = (undefined8 *)(in_RDI + 0x168);
          if (*(long *)(in_RDI + 0x170) != 0) {
            piVar1 = *(int **)(in_RDI + 0x170);
            LOCK();
            iVar7 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (iVar7 == 1) {
              if (*(long *)(in_RDI + 0x188) == 0) {
                if ((void *)*puVar5 != (void *)0x0) {
                  free((void *)*puVar5);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x188) + 0x18))
                          (*(long **)(in_RDI + 0x188),*puVar5);
              }
            }
          }
          *puVar5 = 0;
          *(undefined8 *)(in_RDI + 0x178) = 0;
          *(undefined4 *)(in_RDI + 0x180) = 0;
          *(undefined4 *)(in_RDI + 400) = 0;
          *(undefined4 *)(in_RDI + 0x194) = 0;
          *(undefined4 *)(in_RDI + 0x198) = 0;
          *(undefined4 *)(in_RDI + 0x19c) = 0;
          *(undefined4 *)(in_RDI + 0x1a0) = 0;
          *(undefined8 *)(in_RDI + 0x1a8) = 0;
          *(undefined8 *)(in_RDI + 0x170) = 0;
        }
        local_124 = 0;
      }
    }
    else {
      local_124 = create_pipeline_int8_x86
                            ((ConvolutionDepthWise_x86_avx *)
                             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                             in_stack_fffffffffffffe48);
    }
  }
  else {
    local_124 = 0;
  }
  return local_124;
}

Assistant:

int ConvolutionDepthWise_x86_avx::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            // depth-wise specific
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                weight_data_tm = weight_data;
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                weight_data_tm = weight_data;
            }
            else
            {
                create_group_ops(opt);
            }
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}